

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::strTree<char_const(&)[4],kj::Vector<char>&,char>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [4],Vector<char> *params_1,
          char *params_2)

{
  undefined1 local_41 [9];
  long local_38;
  kj *local_30;
  char *local_28;
  
  local_28 = (char *)strlen((char *)this);
  local_41._1_8_ = *(undefined8 *)params;
  local_38 = *(long *)(params + 2) - local_41._1_8_;
  local_41[0] = *(undefined1 *)&(params_1->builder).ptr;
  local_30 = this;
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(StringTree *)&stack0xffffffffffffffd0,
             (ArrayPtr<const_char> *)(local_41 + 1),(ArrayPtr<const_char> *)local_41,
             (FixedArray<char,_1UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}